

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void srunner_free(SRunner *sr)

{
  List *pLVar1;
  int iVar2;
  Suite *s;
  TestResult *tr_00;
  TestResult *tr;
  List *l;
  SRunner *sr_local;
  
  if (sr != (SRunner *)0x0) {
    free(sr->stats);
    pLVar1 = sr->slst;
    check_list_front(pLVar1);
    while (iVar2 = check_list_at_end(pLVar1), iVar2 == 0) {
      s = (Suite *)check_list_val(pLVar1);
      suite_free(s);
      check_list_advance(pLVar1);
    }
    check_list_free(sr->slst);
    pLVar1 = sr->resultlst;
    check_list_front(pLVar1);
    while (iVar2 = check_list_at_end(pLVar1), iVar2 == 0) {
      tr_00 = (TestResult *)check_list_val(pLVar1);
      tr_free(tr_00);
      check_list_advance(pLVar1);
    }
    check_list_free(sr->resultlst);
    free(sr);
  }
  return;
}

Assistant:

void srunner_free(SRunner * sr)
{
    List *l;

    if(sr == NULL)
        return;

    free(sr->stats);
    l = sr->slst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        suite_free((Suite *)check_list_val(l));
    }
    check_list_free(sr->slst);

    l = sr->resultlst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        TestResult *tr = (TestResult *)check_list_val(l);
        tr_free(tr);
    }
    check_list_free(sr->resultlst);

    free(sr);
}